

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 uVar1;
  pointer pUVar2;
  uint64 value;
  anon_union_8_5_912831f5_for_data_ aVar3;
  string *s;
  bool bVar4;
  anon_union_8_5_912831f5_for_data_ *ptr;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint8 *target_00;
  uint32 *puVar9;
  int i;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  pointer pUVar13;
  anon_union_8_5_912831f5_for_data_ *local_50;
  EpsCopyOutputStream *local_48;
  uint8 *local_40;
  size_t local_38;
  
  lVar10 = 0;
  local_50 = (anon_union_8_5_912831f5_for_data_ *)target;
  local_48 = stream;
  do {
    pUVar2 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(unknown_fields->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4) <=
        lVar10) {
      return (uint8 *)local_50;
    }
    io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 **)&local_50);
    ptr = local_50;
    if (pUVar2[lVar10].type_ < 5) {
      pUVar13 = pUVar2 + lVar10;
      switch(pUVar2[lVar10].type_) {
      case 0:
        value = (pUVar13->data_).varint_;
        target_00 = io::CodedOutputStream::WriteVarint32ToArray
                              (pUVar13->number_ << 3,(uint8 *)&local_50->varint_);
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   io::CodedOutputStream::WriteVarint64ToArray(value,target_00);
        break;
      case 1:
        uVar1 = (pUVar13->data_).fixed32_;
        puVar9 = (uint32 *)
                 io::CodedOutputStream::WriteVarint32ToArray
                           (pUVar13->number_ * 8 + 5,(uint8 *)&local_50->varint_);
        *puVar9 = uVar1;
        local_50 = (anon_union_8_5_912831f5_for_data_ *)(puVar9 + 1);
        stream = local_48;
        break;
      case 2:
        aVar3 = pUVar13->data_;
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   io::CodedOutputStream::WriteVarint32ToArray
                             (pUVar13->number_ * 8 + 1,(uint8 *)&local_50->varint_);
        *local_50 = aVar3;
        local_50 = local_50 + 1;
        break;
      case 3:
        uVar1 = pUVar13->number_;
        s = (string *)(pUVar13->data_).group_;
        if ((long)s->_M_string_length < 0x80) {
          local_40 = local_48->end_;
          uVar7 = uVar1 * 8;
          local_38 = s->_M_string_length;
          iVar6 = io::EpsCopyOutputStream::TagSize(uVar7);
          sVar5 = local_38;
          stream = local_48;
          if ((long)local_38 <= (long)(local_40 + ~(ulong)((long)iVar6 + (long)ptr) + 0x10)) {
            if (uVar7 < 0x80) {
              *(byte *)ptr = (byte)uVar7 | 2;
              pbVar11 = (byte *)((long)ptr + 1);
            }
            else {
              *(byte *)ptr = (byte)uVar7 | 0x82;
              if (uVar7 < 0x4000) {
                *(byte *)((long)ptr + 1) = (byte)(uVar7 >> 7);
                pbVar11 = (byte *)((long)ptr + 2);
              }
              else {
                pbVar11 = (byte *)((long)ptr + 2);
                uVar7 = uVar7 >> 7;
                do {
                  pbVar12 = pbVar11;
                  pbVar12[-1] = (byte)uVar7 | 0x80;
                  uVar8 = uVar7 >> 7;
                  pbVar11 = pbVar12 + 1;
                  bVar4 = 0x3fff < uVar7;
                  uVar7 = uVar8;
                } while (bVar4);
                *pbVar12 = (byte)uVar8;
              }
            }
            *pbVar11 = (byte)local_38;
            memcpy(pbVar11 + 1,(s->_M_dataplus)._M_p,local_38);
            local_50 = (anon_union_8_5_912831f5_for_data_ *)(pbVar11 + sVar5 + 1);
            break;
          }
        }
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   io::EpsCopyOutputStream::WriteStringOutline
                             (stream,uVar1,s,(uint8 *)&ptr->varint_);
        break;
      case 4:
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   io::CodedOutputStream::WriteVarint32ToArray
                             (pUVar13->number_ * 8 + 3,(uint8 *)&local_50->varint_);
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   InternalSerializeUnknownFieldsToArray
                             ((pUVar13->data_).group_,(uint8 *)&local_50->varint_,stream);
        io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 **)&local_50);
        local_50 = (anon_union_8_5_912831f5_for_data_ *)
                   io::CodedOutputStream::WriteVarint32ToArray
                             (pUVar13->number_ * 8 + 4,(uint8 *)&local_50->varint_);
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    stream->EnsureSpace(&target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        stream->EnsureSpace(&target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}